

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSocketMonitorTests::TestaddWrite_WriteSocketAlreadyExists_False::
TestaddWrite_WriteSocketAlreadyExists_False(TestaddWrite_WriteSocketAlreadyExists_False *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"addWrite_WriteSocketAlreadyExists_False","SocketMonitorTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SocketMonitorTestCase.cpp"
             ,0x43);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00321090;
  return;
}

Assistant:

TEST(addWrite_WriteSocketAlreadyExists_False)
{
  SocketMonitor monitor;
  int socket = 101;
  monitor.addRead(socket);
  monitor.addWrite(socket);

  CHECK(!monitor.addWrite(socket));

  socket_close(socket);
}